

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nam.cpp
# Opt level: O2

bool mg::data::nam_write(Nam *in,string *out)

{
  pointer pbVar1;
  pointer pcVar2;
  long lVar3;
  size_type i;
  ulong uVar4;
  
  lVar3 = 0;
  std::__cxx11::string::resize
            ((ulong)out,
             ((char)(in->names).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (char)(in->names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) + ' ');
  for (uVar4 = 0;
      pbVar1 = (in->names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(in->names).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar4 = uVar4 + 1) {
    pcVar2 = (out->_M_dataplus)._M_p;
    strncpy(pcVar2 + lVar3,*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar3),0x20);
    pcVar2 = pcVar2 + lVar3 + 0x1e;
    pcVar2[0] = '\r';
    pcVar2[1] = '\n';
    lVar3 = lVar3 + 0x20;
  }
  return true;
}

Assistant:

bool nam_write(const Nam &in, std::string &out) {
  // Resize output buffer to fit string table + EOF marker
  out.resize((in.names.size() + 1) * Nam::MAX_STRLEN, '\0');

  // Insert each name, truncating if too long
  for (std ::vector<std::string>::size_type i = 0; i < in.names.size(); i++) {
    char *out_ptr = &out[i * Nam::MAX_STRLEN];
    strncpy(out_ptr, in.names[i].c_str(), Nam::MAX_STRLEN);

    // Final 2 bytes must be \r\n
    out_ptr[30] = '\r';
    out_ptr[31] = '\n';
  }

  return true;
}